

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_hashtable.cpp
# Opt level: O1

void __thiscall
duckdb::GroupedAggregateHashTable::AggregateHTAppendState::AggregateHTAppendState
          (AggregateHTAppendState *this,ArenaAllocator *allocator)

{
  LogicalType local_90;
  LogicalType local_78;
  LogicalType local_60;
  LogicalType local_48;
  
  PartitionedTupleDataAppendState::PartitionedTupleDataAppendState(&this->partitioned_append_state);
  PartitionedTupleDataAppendState::PartitionedTupleDataAppendState
            (&this->unpartitioned_append_state);
  LogicalType::LogicalType(&local_48,UBIGINT);
  Vector::Vector(&this->hashes,&local_48,0x800);
  LogicalType::~LogicalType(&local_48);
  LogicalType::LogicalType(&local_60,UBIGINT);
  Vector::Vector(&this->ht_offsets,&local_60,0x800);
  LogicalType::~LogicalType(&local_60);
  LogicalType::LogicalType(&local_78,UBIGINT);
  Vector::Vector(&this->hash_salts,&local_78,0x800);
  LogicalType::~LogicalType(&local_78);
  SelectionVector::SelectionVector(&this->group_compare_vector,0x800);
  SelectionVector::SelectionVector(&this->no_match_vector,0x800);
  SelectionVector::SelectionVector(&this->empty_vector,0x800);
  SelectionVector::SelectionVector(&this->new_groups,0x800);
  LogicalType::LogicalType(&local_90,POINTER);
  Vector::Vector(&this->addresses,&local_90,0x800);
  LogicalType::~LogicalType(&local_90);
  DataChunk::DataChunk(&this->group_chunk);
  AggregateDictionaryState::AggregateDictionaryState(&this->dict_state);
  (this->row_state).allocator = allocator;
  (this->row_state).addresses.super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>
  ._M_t.super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
  super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl = (Vector *)0x0;
  return;
}

Assistant:

GroupedAggregateHashTable::AggregateHTAppendState::AggregateHTAppendState(ArenaAllocator &allocator)
    : hashes(LogicalType::HASH), ht_offsets(LogicalType::UBIGINT), hash_salts(LogicalType::HASH),
      group_compare_vector(STANDARD_VECTOR_SIZE), no_match_vector(STANDARD_VECTOR_SIZE),
      empty_vector(STANDARD_VECTOR_SIZE), new_groups(STANDARD_VECTOR_SIZE), addresses(LogicalType::POINTER),
      row_state(allocator) {
}